

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int slang::editDistance(string_view left,string_view right,bool allowReplacements,int maxDistance)

{
  ulong index;
  char cVar1;
  char cVar2;
  reference piVar3;
  reference piVar4;
  size_type index_00;
  undefined3 in_register_00000081;
  ulong uVar5;
  int iVar6;
  int iVar7;
  size_type index_01;
  ulong uVar8;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  undefined4 local_108;
  int local_104;
  size_t local_100;
  size_type local_f8;
  ulong local_f0;
  ulong local_e8;
  char *local_e0;
  char *local_d8;
  long local_d0;
  SmallVector<int,_32UL> row;
  
  local_108 = CONCAT31(in_register_00000081,allowReplacements);
  local_e0 = left._M_str;
  local_100 = left._M_len;
  local_d8 = right._M_str;
  index_00 = right._M_len;
  uVar8 = (ulong)(uint)maxDistance;
  SmallVector<int,_32UL>::SmallVector((SmallVector<int,_32UL> *)&row.super_SmallVectorBase<int>);
  for (local_110 = 0; local_110 <= (int)right._M_len; local_110 = local_110 + 1) {
    SmallVectorBase<int>::emplace_back<int_const&>(&row.super_SmallVectorBase<int>,&local_110);
  }
  local_10c = maxDistance + 1;
  uVar5 = 1;
  local_f8 = index_00;
  local_e8 = uVar8;
  do {
    if (local_100 < uVar5) {
      piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index_00);
      iVar7 = *piVar3;
      break;
    }
    piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,0);
    *piVar3 = (int)uVar5;
    piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,0);
    local_114 = *piVar3;
    local_d0 = uVar5 - 1;
    local_118 = (int)local_d0;
    index_01 = 0;
    local_f0 = uVar5;
    while (index = index_01 + 1, index <= index_00) {
      piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index);
      local_104 = *piVar3;
      cVar1 = local_e0[local_d0];
      cVar2 = local_d8[index_01];
      if ((char)local_108 == '\0') {
        if (cVar1 == cVar2) {
          piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index);
          *piVar3 = local_118;
        }
        else {
          piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index_01);
          piVar4 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index);
          iVar7 = *piVar4;
          iVar6 = *piVar3;
          piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index);
          if (iVar7 < iVar6) {
            iVar6 = iVar7;
          }
          *piVar3 = iVar6 + 1;
        }
      }
      else {
        piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index_01);
        piVar4 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index);
        iVar7 = *piVar4;
        iVar6 = *piVar3;
        piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index);
        local_118 = local_118 + (uint)(cVar1 != cVar2);
        if (iVar7 < iVar6) {
          iVar6 = iVar7;
        }
        iVar7 = iVar6 + 1;
        if (local_118 <= iVar6 + 1) {
          iVar7 = local_118;
        }
        *piVar3 = iVar7;
        index_00 = local_f8;
        uVar5 = local_f0;
      }
      piVar3 = SmallVectorBase<int>::operator[](&row.super_SmallVectorBase<int>,index);
      if (*piVar3 < local_114) {
        local_114 = *piVar3;
      }
      local_118 = local_104;
      index_01 = index;
      uVar8 = local_e8;
    }
    uVar5 = uVar5 + 1;
  } while (((int)uVar8 == 0) || (iVar7 = local_10c, local_114 <= (int)uVar8));
  SmallVectorBase<int>::~SmallVectorBase(&row.super_SmallVectorBase<int>);
  return iVar7;
}

Assistant:

int editDistance(string_view left, string_view right, bool allowReplacements, int maxDistance) {
    // See: http://en.wikipedia.org/wiki/Levenshtein_distance
    size_t m = left.size();
    size_t n = right.size();

    SmallVector<int, 32> row(n, UninitializedTag());
    for (int i = 0; i <= int(n); i++)
        row.push_back(i);

    for (size_t y = 1; y <= m; y++) {
        row[0] = int(y);
        int best = row[0];

        int prev = int(y - 1);
        for (size_t x = 1; x <= n; x++) {
            int old = row[x];
            if (allowReplacements) {
                row[x] = std::min(prev + (left[y - 1] == right[x - 1] ? 0 : 1),
                                  std::min(row[x - 1], row[x]) + 1);
            }
            else {
                if (left[y - 1] == right[x - 1])
                    row[x] = prev;
                else
                    row[x] = std::min(row[x - 1], row[x]) + 1;
            }

            prev = old;
            best = std::min(best, row[x]);
        }

        if (maxDistance && best > maxDistance)
            return maxDistance + 1;
    }

    return row[n];
}